

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

void capnp::compiler::anon_unknown_0::doTest(void)

{
  Builder decl_00;
  Builder decl_01;
  Builder decl_02;
  Builder params;
  Reader file1;
  Reader file1_00;
  Reader file2;
  Reader file2_00;
  bool bVar1;
  int iVar2;
  MallocMessageBuilder *pMVar3;
  size_t sVar4;
  ulong uVar5;
  int *piVar6;
  MallocMessageBuilder *this;
  Own<capnp::MallocMessageBuilder> *other;
  char (*params_1) [7];
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ArrayPtr<kj::ConstFunction<capnp::compiler::(anonymous_namespace)::ChangeInfo_(capnp::compiler::Declaration::Builder,_unsigned_int_&,_bool)>_>
  arr;
  bool local_a62;
  Builder local_9e0;
  Reader local_9b8;
  Reader local_988;
  Reader local_958;
  Builder local_928;
  Reader local_900;
  undefined1 local_8d0 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_evolution_test_c__:840:5)>
  _kjContext840;
  anon_class_8_1_1e60de3c _kjContextFunc840;
  ChangeInfo local_848;
  undefined *local_828;
  ConstFunction<capnp::compiler::(anonymous_namespace)::ChangeInfo_(capnp::compiler::Declaration::Builder,_unsigned_int_&,_bool)>
  *pCStack_820;
  ConstFunction<capnp::compiler::(anonymous_namespace)::ChangeInfo_(capnp::compiler::Declaration::Builder,_unsigned_int_&,_bool)>
  *local_818;
  ConstFunction<capnp::compiler::(anonymous_namespace)::ChangeInfo_(capnp::compiler::Declaration::Builder,_unsigned_int_&,_bool)>
  *mod;
  ChangeInfo changeInfo;
  Builder local_7c8;
  undefined1 auStack_7a0 [8];
  Builder decl_4;
  Builder parsedFile_1;
  Reader local_728;
  undefined1 local_6f8 [8];
  Own<capnp::MallocMessageBuilder> newBuilder;
  uint local_6e0;
  uint oldOrdinalCount;
  uint i_2;
  uint nextOrdinal;
  SegmentBuilder *pSStack_6d0;
  CapTableBuilder *local_6c8;
  void *pvStack_6c0;
  WirePointer *local_6b8;
  ChangeInfo local_6b0;
  int local_68c;
  Iterator local_688;
  int j;
  Iterator __end4;
  Iterator __begin4;
  Range<int> *__range4;
  char *pcStack_668;
  uint ordinal;
  size_t sStack_660;
  Builder local_650;
  undefined1 local_628 [8];
  Builder field_1;
  Builder local_5d8;
  ArrayPtr<const_char> local_5b0;
  Builder local_5a0;
  Builder local_578;
  undefined1 local_550 [8];
  Builder fieldDecl_1;
  String local_520;
  ArrayPtr<const_char> local_508;
  Builder local_4f8;
  ArrayPtr<const_char> *local_4d0;
  TypeOption *option;
  Builder decl_3;
  uint i_1;
  Builder local_470;
  ArrayPtr<const_char> local_448;
  Builder local_438;
  undefined1 local_410 [8];
  Builder enumerantDecl;
  undefined1 local_3e0 [4];
  uint i;
  Builder enumerants;
  ArrayPtr<const_char> local_3b0;
  Builder local_3a0;
  undefined1 local_378 [8];
  Builder decl_2;
  Builder local_340;
  undefined1 local_318 [8];
  Builder field;
  Builder local_2c8;
  ArrayPtr<const_char> local_2a0;
  Builder local_290;
  Builder local_268;
  undefined1 local_240 [8];
  Builder fieldDecl;
  ArrayPtr<const_char> local_210;
  Builder local_200;
  undefined1 local_1d8 [8];
  Builder decl_1;
  Builder local_1a8;
  Builder local_180;
  ArrayPtr<const_char> local_158;
  Builder local_148;
  undefined1 local_120 [8];
  Builder decl;
  Builder decls;
  Builder local_a8;
  undefined1 local_78 [8];
  Builder file;
  undefined1 local_40 [8];
  Builder parsedFile;
  Own<capnp::MallocMessageBuilder> builder;
  
  kj::heap<capnp::MallocMessageBuilder>();
  pMVar3 = kj::Own<capnp::MallocMessageBuilder>::operator->
                     ((Own<capnp::MallocMessageBuilder> *)&parsedFile._builder.dataSize);
  MessageBuilder::initRoot<capnp::compiler::ParsedFile>
            ((Builder *)local_40,&pMVar3->super_MessageBuilder);
  ParsedFile::Builder::initRoot((Builder *)local_78,(Builder *)local_40);
  Declaration::Builder::setFile((Builder *)local_78);
  Declaration::Builder::initId((Builder *)&decls.builder.structDataSize,(Builder *)local_78);
  Declaration::Id::Builder::initUid(&local_a8,(Builder *)&decls.builder.structDataSize);
  LocatedInteger::Builder::setValue(&local_a8,0x8123456789abcdef);
  sVar4 = kj::size<capnp::compiler::(anonymous_namespace)::TypeOption_const,8ul>
                    ((TypeOption (*) [8])(anonymous_namespace)::TYPE_OPTIONS);
  Declaration::Builder::initNestedDecls
            ((Builder *)&decl._builder.dataSize,(Builder *)local_78,(int)sVar4 + 3);
  List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_120,(Builder *)&decl._builder.dataSize,0);
  Declaration::Builder::initName(&local_148,(Builder *)local_120);
  Text::Reader::Reader((Reader *)&local_158,"EvolvingStruct");
  LocatedText::Builder::setValue(&local_148,(Reader)local_158);
  Declaration::Builder::initId(&local_1a8,(Builder *)local_120);
  Declaration::Id::Builder::initUid(&local_180,&local_1a8);
  LocatedInteger::Builder::setValue(&local_180,0x823456789abcdef1);
  Declaration::Builder::setStruct((Builder *)local_120);
  List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_1d8,(Builder *)&decl._builder.dataSize,1);
  Declaration::Builder::initName(&local_200,(Builder *)local_1d8);
  Text::Reader::Reader((Reader *)&local_210,"StructType");
  LocatedText::Builder::setValue(&local_200,(Reader)local_210);
  Declaration::Builder::setStruct((Builder *)local_1d8);
  Declaration::Builder::initNestedDecls(&local_268,(Builder *)local_1d8,1);
  List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_240,&local_268,0);
  Declaration::Builder::initName(&local_290,(Builder *)local_240);
  Text::Reader::Reader((Reader *)&local_2a0,"i");
  LocatedText::Builder::setValue(&local_290,(Reader)local_2a0);
  Declaration::Builder::getId((Builder *)&field._builder.dataSize,(Builder *)local_240);
  Declaration::Id::Builder::initOrdinal(&local_2c8,(Builder *)&field._builder.dataSize);
  LocatedInteger::Builder::setValue(&local_2c8,0);
  Declaration::Builder::initField((Builder *)local_318,(Builder *)local_240);
  Declaration::Field::Builder::initType(&local_340,(Builder *)local_318);
  kj::StringPtr::StringPtr((StringPtr *)&decl_2._builder.dataSize,"UInt32");
  decl_00._builder.capTable = local_340._builder.capTable;
  decl_00._builder.segment = local_340._builder.segment;
  decl_00._builder.data = local_340._builder.data;
  decl_00._builder.pointers = local_340._builder.pointers;
  decl_00._builder.dataSize = local_340._builder.dataSize;
  decl_00._builder.pointerCount = local_340._builder.pointerCount;
  decl_00._builder._38_2_ = local_340._builder._38_2_;
  setDeclName(decl_00,(StringPtr)stack0xfffffffffffffcb0);
  List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_378,(Builder *)&decl._builder.dataSize,2);
  Declaration::Builder::initName(&local_3a0,(Builder *)local_378);
  Text::Reader::Reader((Reader *)&local_3b0,"EnumType");
  LocatedText::Builder::setValue(&local_3a0,(Reader)local_3b0);
  Declaration::Builder::setEnum((Builder *)local_378);
  Declaration::Builder::initNestedDecls((Builder *)local_3e0,(Builder *)local_378,4);
  enumerantDecl._builder.pointerCount = 0;
  enumerantDecl._builder._38_2_ = 0;
  for (; uVar5 = (ulong)(uint)enumerantDecl._builder._36_4_,
      sVar4 = kj::size<kj::StringPtr_const,4ul>((StringPtr (*) [4])(anonymous_namespace)::RFC3092),
      uVar5 < sVar4; enumerantDecl._builder._36_4_ = enumerantDecl._builder._36_4_ + 1) {
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_410,(Builder *)local_3e0,enumerantDecl._builder._36_4_);
    Declaration::Builder::initName(&local_438,(Builder *)local_410);
    Text::Reader::Reader
              ((Reader *)&local_448,
               (StringPtr *)
               ((anonymous_namespace)::RFC3092 + (ulong)(uint)enumerantDecl._builder._36_4_ * 0x10))
    ;
    LocatedText::Builder::setValue(&local_438,(Reader)local_448);
    Declaration::Builder::getId((Builder *)&i_1,(Builder *)local_410);
    Declaration::Id::Builder::initOrdinal(&local_470,(Builder *)&i_1);
    LocatedInteger::Builder::setValue(&local_470,(ulong)(uint)enumerantDecl._builder._36_4_);
    Declaration::Builder::setEnumerant((Builder *)local_410);
  }
  for (decl_3._builder.dataSize = 0; uVar5 = (ulong)decl_3._builder.dataSize,
      sVar4 = kj::size<capnp::compiler::(anonymous_namespace)::TypeOption_const,8ul>
                        ((TypeOption (*) [8])(anonymous_namespace)::TYPE_OPTIONS), uVar5 < sVar4;
      decl_3._builder.dataSize = decl_3._builder.dataSize + 1) {
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)&option,(Builder *)&decl._builder.dataSize,decl_3._builder.dataSize + 3);
    params_1 = (char (*) [7])((ulong)decl_3._builder.dataSize * 0x20);
    local_4d0 = (ArrayPtr<const_char> *)(params_1[0x85bed] + 5);
    Declaration::Builder::initName(&local_4f8,(Builder *)&option);
    kj::str<kj::StringPtr_const&,char_const(&)[7]>
              (&local_520,(kj *)local_4d0,(StringPtr *)0x31eb7d,params_1);
    Text::Reader::Reader((Reader *)&local_508,&local_520);
    LocatedText::Builder::setValue(&local_4f8,(Reader)local_508);
    kj::String::~String(&local_520);
    Declaration::Builder::setStruct((Builder *)&option);
    Declaration::Builder::initNestedDecls(&local_578,(Builder *)&option,1);
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_550,&local_578,0);
    Declaration::Builder::initName(&local_5a0,(Builder *)local_550);
    Text::Reader::Reader((Reader *)&local_5b0,"f0");
    LocatedText::Builder::setValue(&local_5a0,(Reader)local_5b0);
    Declaration::Builder::getId((Builder *)&field_1._builder.dataSize,(Builder *)local_550);
    Declaration::Id::Builder::initOrdinal(&local_5d8,(Builder *)&field_1._builder.dataSize);
    LocatedInteger::Builder::setValue(&local_5d8,0);
    Declaration::Builder::initField((Builder *)local_628,(Builder *)local_550);
    Declaration::Field::Builder::initType(&local_650,(Builder *)local_628);
    pcStack_668 = local_4d0->ptr;
    sStack_660 = local_4d0->size_;
    decl_01._builder.capTable = local_650._builder.capTable;
    decl_01._builder.segment = local_650._builder.segment;
    decl_01._builder.data = local_650._builder.data;
    decl_01._builder.pointers = local_650._builder.pointers;
    decl_01._builder.dataSize = local_650._builder.dataSize;
    decl_01._builder.pointerCount = local_650._builder.pointerCount;
    decl_01._builder._38_2_ = local_650._builder._38_2_;
    setDeclName(decl_01,(StringPtr)*local_4d0);
    __range4._4_4_ = 1;
    iVar2 = rand();
    ___end4 = kj::range<int>(0,iVar2 % 4);
    j = (int)kj::Range<int>::begin((Range<int> *)&__end4);
    local_688 = kj::Range<int>::end((Range<int> *)&__end4);
    while (bVar1 = kj::Range<int>::Iterator::operator!=((Iterator *)&j,&local_688), bVar1) {
      piVar6 = kj::Range<int>::Iterator::operator*((Iterator *)&j);
      local_68c = *piVar6;
      local_6b8 = decl_3._builder.pointers;
      local_6c8 = decl_3._builder.capTable;
      pvStack_6c0 = decl_3._builder.data;
      _i_2 = option;
      pSStack_6d0 = decl_3._builder.segment;
      decl_02._builder.capTable = (CapTableBuilder *)decl_3._builder.segment;
      decl_02._builder.segment = (SegmentBuilder *)option;
      decl_02._builder.data = decl_3._builder.capTable;
      decl_02._builder.pointers = (WirePointer *)decl_3._builder.data;
      decl_02._builder._32_8_ = decl_3._builder.pointers;
      structAddField(&local_6b0,decl_02,(uint *)((long)&__range4 + 4),false);
      ChangeInfo::~ChangeInfo(&local_6b0);
      kj::Range<int>::Iterator::operator++((Iterator *)&j);
    }
  }
  oldOrdinalCount = 0;
  for (local_6e0 = 0; local_6e0 < 0x60; local_6e0 = local_6e0 + 1) {
    newBuilder.ptr._4_4_ = oldOrdinalCount;
    kj::heap<capnp::MallocMessageBuilder>();
    pMVar3 = kj::Own<capnp::MallocMessageBuilder>::operator->
                       ((Own<capnp::MallocMessageBuilder> *)local_6f8);
    this = kj::Own<capnp::MallocMessageBuilder>::operator->
                     ((Own<capnp::MallocMessageBuilder> *)&parsedFile._builder.dataSize);
    MessageBuilder::getRoot<capnp::compiler::ParsedFile>
              ((Builder *)&parsedFile_1._builder.dataSize,&this->super_MessageBuilder);
    ParsedFile::Builder::asReader(&local_728,(Builder *)&parsedFile_1._builder.dataSize);
    MessageBuilder::setRoot<capnp::compiler::ParsedFile::Reader>
              (&pMVar3->super_MessageBuilder,&local_728);
    pMVar3 = kj::Own<capnp::MallocMessageBuilder>::operator->
                       ((Own<capnp::MallocMessageBuilder> *)local_6f8);
    MessageBuilder::getRoot<capnp::compiler::ParsedFile>
              ((Builder *)&decl_4._builder.dataSize,&pMVar3->super_MessageBuilder);
    ParsedFile::Builder::getRoot
              ((Builder *)&changeInfo.description.content.disposer,
               (Builder *)&decl_4._builder.dataSize);
    Declaration::Builder::getNestedDecls
              (&local_7c8,(Builder *)&changeInfo.description.content.disposer);
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)auStack_7a0,&local_7c8,0);
    ChangeInfo::ChangeInfo((ChangeInfo *)&mod);
    sVar4 = extraout_RDX;
    while ((ChangeKind)mod == NO_CHANGE) {
      local_828 = (anonymous_namespace)::STRUCT_MODS;
      pCStack_820 = DAT_003a8288;
      arr.size_ = sVar4;
      arr.ptr = DAT_003a8288;
      local_818 = (anonymous_namespace)::
                  chooseFrom<kj::ArrayPtr<kj::ConstFunction<capnp::compiler::(anonymous_namespace)::ChangeInfo(capnp::compiler::Declaration::Builder,unsigned_int&,bool)>>>
                            ((_anonymous_namespace_ *)(anonymous_namespace)::STRUCT_MODS,arr);
      params._builder.capTable = (CapTableBuilder *)decl_4._builder.segment;
      params._builder.segment = (SegmentBuilder *)auStack_7a0;
      params._builder.data = decl_4._builder.capTable;
      params._builder.pointers = (WirePointer *)decl_4._builder.data;
      params._builder._32_8_ = decl_4._builder.pointers;
      kj::
      ConstFunction<capnp::compiler::(anonymous_namespace)::ChangeInfo_(capnp::compiler::Declaration::Builder,_unsigned_int_&,_bool)>
      ::operator()(&local_848,local_818,params,&oldOrdinalCount,false);
      ChangeInfo::operator=((ChangeInfo *)&mod,&local_848);
      ChangeInfo::~ChangeInfo(&local_848);
      sVar4 = extraout_RDX_00;
    }
    _kjContext840.func = (anon_class_8_1_1e60de3c *)&mod;
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++:840:5)>
    ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_evolution_test_c__:840:5)>
                   *)local_8d0,(anon_class_8_1_1e60de3c *)&_kjContext840.func);
    pMVar3 = kj::Own<capnp::MallocMessageBuilder>::operator->
                       ((Own<capnp::MallocMessageBuilder> *)&parsedFile._builder.dataSize);
    MessageBuilder::getRoot<capnp::compiler::ParsedFile>(&local_928,&pMVar3->super_MessageBuilder);
    ParsedFile::Builder::operator_cast_to_Reader(&local_900,&local_928);
    ParsedFile::Builder::operator_cast_to_Reader(&local_958,(Builder *)&decl_4._builder.dataSize);
    file1._reader.capTable = local_900._reader.capTable;
    file1._reader.segment = local_900._reader.segment;
    file1._reader.data = local_900._reader.data;
    file1._reader.pointers = local_900._reader.pointers;
    file1._reader.dataSize = local_900._reader.dataSize;
    file1._reader.pointerCount = local_900._reader.pointerCount;
    file1._reader._38_2_ = local_900._reader._38_2_;
    file1._reader.nestingLimit = local_900._reader.nestingLimit;
    file1._reader._44_4_ = local_900._reader._44_4_;
    file2._reader.capTable = local_958._reader.capTable;
    file2._reader.segment = local_958._reader.segment;
    file2._reader.data = local_958._reader.data;
    file2._reader.pointers = local_958._reader.pointers;
    file2._reader.dataSize = local_958._reader.dataSize;
    file2._reader.pointerCount = local_958._reader.pointerCount;
    file2._reader._38_2_ = local_958._reader._38_2_;
    file2._reader.nestingLimit = local_958._reader.nestingLimit;
    file2._reader._44_4_ = local_958._reader._44_4_;
    bVar1 = checkChange(file1,file2,(ChangeKind)mod,newBuilder.ptr._4_4_);
    local_a62 = false;
    if (bVar1) {
      ParsedFile::Builder::operator_cast_to_Reader(&local_988,(Builder *)&decl_4._builder.dataSize);
      pMVar3 = kj::Own<capnp::MallocMessageBuilder>::operator->
                         ((Own<capnp::MallocMessageBuilder> *)&parsedFile._builder.dataSize);
      MessageBuilder::getRoot<capnp::compiler::ParsedFile>(&local_9e0,&pMVar3->super_MessageBuilder)
      ;
      ParsedFile::Builder::operator_cast_to_Reader(&local_9b8,&local_9e0);
      file1_00._reader.capTable = local_988._reader.capTable;
      file1_00._reader.segment = local_988._reader.segment;
      file1_00._reader.data = local_988._reader.data;
      file1_00._reader.pointers = local_988._reader.pointers;
      file1_00._reader.dataSize = local_988._reader.dataSize;
      file1_00._reader.pointerCount = local_988._reader.pointerCount;
      file1_00._reader._38_2_ = local_988._reader._38_2_;
      file1_00._reader.nestingLimit = local_988._reader.nestingLimit;
      file1_00._reader._44_4_ = local_988._reader._44_4_;
      file2_00._reader.capTable = local_9b8._reader.capTable;
      file2_00._reader.segment = local_9b8._reader.segment;
      file2_00._reader.data = local_9b8._reader.data;
      file2_00._reader.pointers = local_9b8._reader.pointers;
      file2_00._reader.dataSize = local_9b8._reader.dataSize;
      file2_00._reader.pointerCount = local_9b8._reader.pointerCount;
      file2_00._reader._38_2_ = local_9b8._reader._38_2_;
      file2_00._reader.nestingLimit = local_9b8._reader.nestingLimit;
      file2_00._reader._44_4_ = local_9b8._reader._44_4_;
      local_a62 = checkChange(file1_00,file2_00,(ChangeKind)mod,newBuilder.ptr._4_4_);
    }
    if (local_a62 != false) {
      other = kj::mv<kj::Own<capnp::MallocMessageBuilder>>
                        ((Own<capnp::MallocMessageBuilder> *)local_6f8);
      kj::Own<capnp::MallocMessageBuilder>::operator=
                ((Own<capnp::MallocMessageBuilder> *)&parsedFile._builder.dataSize,other);
    }
    kj::_::Debug::
    ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++:840:5)>
    ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_evolution_test_c__:840:5)>
                    *)local_8d0);
    ChangeInfo::~ChangeInfo((ChangeInfo *)&mod);
    kj::Own<capnp::MallocMessageBuilder>::~Own((Own<capnp::MallocMessageBuilder> *)local_6f8);
  }
  kj::Own<capnp::MallocMessageBuilder>::~Own
            ((Own<capnp::MallocMessageBuilder> *)&parsedFile._builder.dataSize);
  return;
}

Assistant:

void doTest() {
  auto builder = kj::heap<MallocMessageBuilder>();

  {
    // Set up the basic file decl.
    auto parsedFile = builder->initRoot<ParsedFile>();
    auto file = parsedFile.initRoot();
    file.setFile();
    file.initId().initUid().setValue(0x8123456789abcdefllu);
    auto decls = file.initNestedDecls(3 + kj::size(TYPE_OPTIONS));

    {
      auto decl = decls[0];
      decl.initName().setValue("EvolvingStruct");
      decl.initId().initUid().setValue(0x823456789abcdef1llu);
      decl.setStruct();
    }
    {
      auto decl = decls[1];
      decl.initName().setValue("StructType");
      decl.setStruct();

      auto fieldDecl = decl.initNestedDecls(1)[0];
      fieldDecl.initName().setValue("i");
      fieldDecl.getId().initOrdinal().setValue(0);
      auto field = fieldDecl.initField();
      setDeclName(field.initType(), "UInt32");
    }
    {
      auto decl = decls[2];
      decl.initName().setValue("EnumType");
      decl.setEnum();

      auto enumerants = decl.initNestedDecls(4);

      for (uint i = 0; i < kj::size(RFC3092); i++) {
        auto enumerantDecl = enumerants[i];
        enumerantDecl.initName().setValue(RFC3092[i]);
        enumerantDecl.getId().initOrdinal().setValue(i);
        enumerantDecl.setEnumerant();
      }
    }

    // For each of TYPE_OPTIONS, declare a struct type that contains that type as its @0 field.
    for (uint i = 0; i < kj::size(TYPE_OPTIONS); i++) {
      auto decl = decls[3 + i];
      auto& option = TYPE_OPTIONS[i];

      decl.initName().setValue(kj::str(option.name, "Struct"));
      decl.setStruct();

      auto fieldDecl = decl.initNestedDecls(1)[0];
      fieldDecl.initName().setValue("f0");
      fieldDecl.getId().initOrdinal().setValue(0);
      auto field = fieldDecl.initField();
      setDeclName(field.initType(), option.name);

      uint ordinal = 1;
      for (auto j: kj::range(0, rand() % 4)) {
        (void)j;
        structAddField(decl, ordinal, false);
      }
    }
  }

  uint nextOrdinal = 0;

  for (uint i = 0; i < 96; i++) {
    uint oldOrdinalCount = nextOrdinal;

    auto newBuilder = kj::heap<MallocMessageBuilder>();
    newBuilder->setRoot(builder->getRoot<ParsedFile>().asReader());

    auto parsedFile = newBuilder->getRoot<ParsedFile>();
    Declaration::Builder decl = parsedFile.getRoot().getNestedDecls()[0];

    // Apply a random modification.
    ChangeInfo changeInfo;
    while (changeInfo.kind == NO_CHANGE) {
      auto& mod = chooseFrom(STRUCT_MODS);
      changeInfo = mod(decl, nextOrdinal, false);
    }

    KJ_CONTEXT(changeInfo.description);

    if (checkChange(builder->getRoot<ParsedFile>(), parsedFile, changeInfo.kind, oldOrdinalCount) &&
        checkChange(parsedFile, builder->getRoot<ParsedFile>(), changeInfo.kind, oldOrdinalCount)) {
      builder = kj::mv(newBuilder);
    }
  }
}